

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Goblin.cpp
# Opt level: O0

void __thiscall Goblin::Goblin(Goblin *this)

{
  Dice *pDVar1;
  Goblin *this_local;
  
  Character::Character(&this->super_Character);
  (this->super_Character)._vptr_Character = (_func_int **)&PTR_RollAttack_0010fd10;
  std::__cxx11::string::operator=((string *)&(this->super_Character).name,"Goblin");
  (this->super_Character).alive = true;
  (this->super_Character).attackDieSides = 6;
  (this->super_Character).attackRolls = 2;
  (this->super_Character).defenceDieSides = 6;
  (this->super_Character).defenceRolls = 1;
  (this->super_Character).armor = 3;
  (this->super_Character).totalStrengthPoints = 8;
  (this->super_Character).currentStrengthPoints = (this->super_Character).totalStrengthPoints;
  this->cutOpponentTendon = false;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,(this->super_Character).attackDieSides);
  (this->super_Character).attackDie = pDVar1;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,(this->super_Character).defenceDieSides);
  (this->super_Character).defenseDie = pDVar1;
  return;
}

Assistant:

Goblin::Goblin()
{
    name = "Goblin";

    alive = true;
    attackDieSides = 6;
    attackRolls = 2;
    defenceDieSides = 6;
    defenceRolls = 1;

    armor = 3;
    totalStrengthPoints = 8;
    currentStrengthPoints = totalStrengthPoints;
    cutOpponentTendon = false;

    attackDie = new Dice(attackDieSides);
    defenseDie = new Dice(defenceDieSides);
}